

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_scope.c
# Opt level: O0

scope scope_create(char *name)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  set psVar4;
  vector pvVar5;
  undefined8 *puVar6;
  char *in_RDI;
  size_t head_index;
  size_t *call_stack_head;
  size_t sp_name_size;
  scope sp;
  vector in_stack_ffffffffffffffc8;
  set in_stack_ffffffffffffffd0;
  set_cb_hash hash_cb;
  scope local_8;
  
  if (in_RDI == (char *)0x0) {
    log_write_impl_va("metacall",0xa4,"scope_create",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                      ,LOG_LEVEL_ERROR,"Scope create invalid parameters");
    local_8 = (scope)0x0;
  }
  else {
    local_8 = (scope)malloc(0x18);
    if (local_8 == (scope)0x0) {
      log_write_impl_va("metacall",0x9f,"scope_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                        ,LOG_LEVEL_ERROR,"Scope create bad allocation");
      local_8 = (scope)0x0;
    }
    else {
      sVar2 = strlen(in_RDI);
      hash_cb = (set_cb_hash)0x0;
      pcVar3 = (char *)malloc(sVar2 + 1);
      local_8->name = pcVar3;
      if (local_8->name == (char *)0x0) {
        log_write_impl_va("metacall",0x5b,"scope_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                          ,LOG_LEVEL_ERROR,"Scope create name bad allocation");
        free(local_8);
        local_8 = (scope)0x0;
      }
      else {
        memcpy(local_8->name,in_RDI,sVar2 + 1);
        psVar4 = set_create(hash_cb,(set_cb_compare)in_stack_ffffffffffffffd0);
        local_8->objects = psVar4;
        if (local_8->objects == (set)0x0) {
          log_write_impl_va("metacall",0x68,"scope_create",
                            "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                            ,LOG_LEVEL_ERROR,"Scope create map bad allocation");
          free(local_8->name);
          free(local_8);
          local_8 = (scope)0x0;
        }
        else {
          pvVar5 = vector_create(0x128d85);
          local_8->call_stack = pvVar5;
          if (local_8->call_stack == (vector)0x0) {
            log_write_impl_va("metacall",0x75,"scope_create",
                              "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                              ,LOG_LEVEL_ERROR,"Scope create call stack bad allocation");
            set_destroy(in_stack_ffffffffffffffd0);
            free(local_8->name);
            free(local_8);
            local_8 = (scope)0x0;
          }
          else {
            iVar1 = vector_resize(in_stack_ffffffffffffffc8,0x128e11);
            if (iVar1 == 0) {
              puVar6 = (undefined8 *)vector_front(local_8->call_stack);
              if (puVar6 == (undefined8 *)0x0) {
                log_write_impl_va("metacall",0x9a,"scope_create",
                                  "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                                  ,LOG_LEVEL_ERROR,"Scope create bad call stack head reference");
                local_8 = (scope)0x0;
              }
              else {
                *puVar6 = 0;
              }
            }
            else {
              log_write_impl_va("metacall",0x82,"scope_create",
                                "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_scope.c"
                                ,LOG_LEVEL_ERROR,"Scope create call stack bad allocation");
              vector_destroy((vector)0x128e52);
              set_destroy(in_stack_ffffffffffffffd0);
              free(local_8->name);
              free(local_8);
              local_8 = (scope)0x0;
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

scope scope_create(const char *name)
{
	if (name != NULL)
	{
		scope sp = malloc(sizeof(struct scope_type));

		if (sp != NULL)
		{
			size_t sp_name_size = strlen(name) + 1;

			size_t *call_stack_head = NULL;

			sp->name = malloc(sizeof(char) * sp_name_size);

			if (sp->name == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create name bad allocation");

				free(sp);

				return NULL;
			}

			memcpy(sp->name, name, sp_name_size);

			sp->objects = set_create(&hash_callback_str, &comparable_callback_str);

			if (sp->objects == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create map bad allocation");

				free(sp->name);

				free(sp);

				return NULL;
			}

			sp->call_stack = vector_create(sizeof(char));

			if (sp->call_stack == NULL)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			if (vector_resize(sp->call_stack, sizeof(size_t)) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Scope create call stack bad allocation");

				vector_destroy(sp->call_stack);

				set_destroy(sp->objects);

				free(sp->name);

				free(sp);

				return NULL;
			}

			call_stack_head = vector_front(sp->call_stack);

			if (call_stack_head != NULL)
			{
				const size_t head_index = 0;

				memcpy(call_stack_head, &head_index, sizeof(size_t));

				return sp;
			}

			log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad call stack head reference");

			return NULL;
		}

		log_write("metacall", LOG_LEVEL_ERROR, "Scope create bad allocation");

		return NULL;
	}

	log_write("metacall", LOG_LEVEL_ERROR, "Scope create invalid parameters");

	return NULL;
}